

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  
  this->lightmode = true;
  iVar1 = get_big_cpu_count();
  this->num_threads = iVar1;
  this->blob_allocator = (Allocator *)0x0;
  this->workspace_allocator = (Allocator *)0x0;
  this->openmp_blocktime = 0x14;
  this->use_winograd_convolution = true;
  this->use_sgemm_convolution = true;
  this->use_int8_inference = true;
  this->use_vulkan_compute = false;
  this->use_bf16_storage = false;
  this->use_int8_storage = true;
  this->use_fp16_packed = true;
  this->use_fp16_storage = true;
  this->use_fp16_arithmetic = true;
  this->use_int8_packed = true;
  this->use_int8_arithmetic = false;
  this->use_packing_layout = true;
  this->use_shader_pack8 = false;
  this->use_subgroup_basic = false;
  this->use_subgroup_vote = false;
  this->use_subgroup_ballot = false;
  this->use_subgroup_shuffle = false;
  this->use_image_storage = false;
  this->use_tensor_storage = false;
  this->use_weight_fp16_storage = false;
  this->flush_denormals = 3;
  this->use_local_pool_allocator = true;
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    num_threads = get_big_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
    pipeline_cache = 0;
#endif // NCNN_VULKAN

    openmp_blocktime = 20;

    use_winograd_convolution = true;
    use_sgemm_convolution = true;
    use_int8_inference = true;
    use_vulkan_compute = false; // TODO enable me

    use_bf16_storage = false;

    use_fp16_packed = true;
    use_fp16_storage = true;
    use_fp16_arithmetic = true;
    use_int8_packed = true;
    use_int8_storage = true;
    use_int8_arithmetic = false;

    use_packing_layout = true;

    use_shader_pack8 = false;

    use_subgroup_basic = false;
    use_subgroup_vote = false;
    use_subgroup_ballot = false;
    use_subgroup_shuffle = false;

    use_image_storage = false;
    use_tensor_storage = false;

    use_weight_fp16_storage = false;

    flush_denormals = 3;

    use_local_pool_allocator = true;
}